

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

void __thiscall Application::processCancel(Application *this,string *id,string *symbol,Side side)

{
  pointer pcVar1;
  Order *order;
  string local_70;
  string local_50;
  
  pcVar1 = (symbol->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + symbol->_M_string_length);
  pcVar1 = (id->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + id->_M_string_length);
  order = OrderMatcher::find((OrderMatcher *)(this + 0x50),&local_50,side,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  order->m_openQuantity = 0;
  updateOrder(this,order,'4');
  OrderMatcher::erase((OrderMatcher *)(this + 0x50),order);
  return;
}

Assistant:

void Application::processCancel(const std::string &id, const std::string &symbol, Order::Side side) {
  Order &order = m_orderMatcher.find(symbol, side, id);
  order.cancel();
  cancelOrder(order);
  m_orderMatcher.erase(order);
}